

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac.c
# Opt level: O0

int omac_key(OMAC_CTX *c,EVP_CIPHER *cipher,uchar *key,size_t key_size)

{
  CMAC_CTX *pCVar1;
  size_t in_RCX;
  void *in_RDX;
  EVP_CIPHER *in_RSI;
  long *in_RDI;
  int ret;
  char *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int iVar2;
  int local_4;
  
  iVar2 = 0;
  CMAC_CTX_free((CMAC_CTX *)*in_RDI);
  pCVar1 = CMAC_CTX_new();
  *in_RDI = (long)pCVar1;
  if (*in_RDI == 0) {
    ERR_GOST_error(iVar2,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    local_4 = 0;
  }
  else {
    iVar2 = CMAC_Init((CMAC_CTX *)*in_RDI,in_RDX,in_RCX,in_RSI,(ENGINE *)0x0);
    if (0 < iVar2) {
      *(undefined4 *)(in_RDI + 3) = 1;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int omac_key(OMAC_CTX * c, const EVP_CIPHER *cipher,
                    const unsigned char *key, size_t key_size)
{
    int ret = 0;

    CMAC_CTX_free(c->cmac_ctx);
    c->cmac_ctx = CMAC_CTX_new();
    if (c->cmac_ctx == NULL) {
        GOSTerr(GOST_F_OMAC_KEY, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    ret = CMAC_Init(c->cmac_ctx, key, key_size, cipher, NULL);
    if (ret > 0) {
        c->key_set = 1;
    }
    return 1;
}